

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O3

void __thiscall
musicBlock::OPLchangeControl(musicBlock *this,uint channel,uchar controller,int value)

{
  OPL2instrument *pOVar1;
  ushort uVar2;
  long lVar3;
  byte bVar4;
  uint volume;
  undefined7 in_register_00000011;
  OPLio *pOVar5;
  byte data2;
  ulong *puVar6;
  channelEntry *pcVar7;
  uchar uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (0x11 < (uint)CONCAT71(in_register_00000011,controller)) {
    return;
  }
  uVar10 = (ulong)channel;
  uVar8 = (uchar)value;
  uVar2 = (ushort)value;
  switch(CONCAT71(in_register_00000011,controller) & 0xffffffff) {
  case 0:
    (this->driverdata).channelInstr[uVar10] = value;
    break;
  case 2:
    (this->driverdata).channelModulation[uVar10] = uVar8;
    pOVar5 = this->io;
    if (pOVar5->OPLchannels != 0) {
      pcVar7 = this->channels;
      uVar10 = 0;
      do {
        if (pcVar7->channel == channel) {
          bVar4 = pcVar7->flags;
          pcVar7->time = this->MLtime;
          if (value < 0x28) {
            pcVar7->flags = bVar4 & 0xfb;
            if ((bVar4 & 0xfb) != bVar4) {
              bVar4 = pcVar7->instr->trem_vibr_1;
              data2 = pcVar7->instr->trem_vibr_2;
              goto LAB_0031c335;
            }
          }
          else {
            pcVar7->flags = bVar4 | 4;
            if ((bVar4 | 4) != bVar4) {
              pOVar1 = pcVar7->instr;
              bVar4 = (pOVar1->feedback & 1) << 6 | pOVar1->trem_vibr_1;
              data2 = pOVar1->trem_vibr_2 | 0x40;
LAB_0031c335:
              OPLio::OPLwriteChannel(pOVar5,0x20,(uint)uVar10,bVar4,data2);
            }
          }
        }
        uVar10 = uVar10 + 1;
        pOVar5 = this->io;
        pcVar7 = pcVar7 + 1;
      } while (uVar10 < pOVar5->OPLchannels);
    }
    break;
  case 3:
    lVar3 = 0x54;
    goto LAB_0031c1d6;
  case 4:
    (this->driverdata).channelPan[uVar10] = (schar)(value + -0x40);
    pOVar5 = this->io;
    if (pOVar5->OPLchannels != 0) {
      puVar6 = &this->channels[0].time;
      uVar10 = 0;
      do {
        if (((channelEntry *)(puVar6 + -4))->channel == channel) {
          *puVar6 = this->MLtime;
          OPLio::OPLwritePan(pOVar5,(uint)uVar10,(OPL2instrument *)puVar6[-1],value + -0x40);
          pOVar5 = this->io;
        }
        uVar10 = uVar10 + 1;
        puVar6 = puVar6 + 5;
      } while (uVar10 < pOVar5->OPLchannels);
    }
    break;
  case 5:
    lVar3 = 0xf4;
LAB_0031c1d6:
    *(uchar *)((long)(this->driverdata).channelInstr + uVar10 + lVar3 + -0x14) = uVar8;
    pOVar5 = this->io;
    if (pOVar5->OPLchannels != 0) {
      puVar6 = &this->channels[0].time;
      uVar9 = 0;
      do {
        if (((channelEntry *)(puVar6 + -4))->channel == channel) {
          *puVar6 = this->MLtime;
          volume = (uint)(((ulong)*(uint *)((long)puVar6 + -0x14) *
                          (ulong)(this->driverdata).channelExpression[uVar10] *
                          (ulong)(this->driverdata).channelVolume[uVar10]) / 0x3f01);
          if (0x7e < volume) {
            volume = 0x7f;
          }
          *(uint *)(puVar6 + -2) = volume;
          OPLio::OPLwriteVolume(pOVar5,(uint)uVar9,(OPL2instrument *)puVar6[-1],volume);
          pOVar5 = this->io;
        }
        uVar9 = uVar9 + 1;
        puVar6 = puVar6 + 5;
      } while (uVar9 < pOVar5->OPLchannels);
    }
    break;
  case 8:
    (this->driverdata).channelSustain[uVar10] = uVar8;
    if (value < 0x40) {
      releaseSustain(this,channel);
      return;
    }
    break;
  case 10:
    (this->driverdata).channelRPN[uVar10] =
         (ushort)(value << 7) | (this->driverdata).channelRPN[uVar10] & 0x7f;
    break;
  case 0xb:
    (this->driverdata).channelRPN[uVar10] = (this->driverdata).channelRPN[uVar10] & 0x3f80 | uVar2;
    break;
  case 0xc:
  case 0xd:
    (this->driverdata).channelRPN[uVar10] = 0x3fff;
    break;
  case 0xe:
    if ((this->driverdata).channelRPN[uVar10] == 0) {
      (this->driverdata).channelPitchSens[uVar10] =
           uVar2 * 100 + (this->driverdata).channelPitchSens[uVar10] % 100;
    }
    break;
  case 0xf:
    if ((this->driverdata).channelRPN[uVar10] == 0) {
      (this->driverdata).channelPitchSens[uVar10] =
           ((this->driverdata).channelPitchSens[uVar10] / 100) * 100 + uVar2;
    }
    break;
  case 0x10:
    pOVar5 = this->io;
    if (pOVar5->OPLchannels != 0) {
      pcVar7 = this->channels;
      uVar10 = 0;
      do {
        if (pcVar7->channel == channel) {
          OPLio::OPLwriteFreq(pOVar5,(uint)uVar10,(uint)pcVar7->realnote,pcVar7->pitch,0);
          pcVar7->channel = pcVar7->channel | 0x80;
          pcVar7->time = this->MLtime;
          pcVar7->flags = 0x80;
          pOVar5 = this->io;
        }
        uVar10 = uVar10 + 1;
        pcVar7 = pcVar7 + 1;
      } while (uVar10 < pOVar5->OPLchannels);
    }
    break;
  case 0x11:
    pOVar5 = this->io;
    if (pOVar5->OPLchannels != 0) {
      pcVar7 = this->channels;
      uVar9 = 0;
      do {
        if (pcVar7->channel == channel) {
          if ((this->driverdata).channelSustain[uVar10] < 0x40) {
            OPLio::OPLwriteFreq(pOVar5,(uint)uVar9,(uint)pcVar7->realnote,pcVar7->pitch,0);
            pcVar7->channel = pcVar7->channel | 0x80;
            pcVar7->time = this->MLtime;
            pcVar7->flags = 0x80;
            pOVar5 = this->io;
          }
          else {
            pcVar7->flags = pcVar7->flags | 2;
          }
        }
        uVar9 = uVar9 + 1;
        pcVar7 = pcVar7 + 1;
      } while (uVar9 < pOVar5->OPLchannels);
    }
  }
  return;
}

Assistant:

void musicBlock::OPLchangeControl(uint channel, uchar controller, int value)
{
	uint i;
	uint id = channel;

	switch (controller)
	{
	case ctrlPatch:			/* change instrument */
		OPLprogramChange(channel, value);
		break;

	case ctrlModulation:
		driverdata.channelModulation[channel] = value;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				uchar flags = ch->flags;
				ch->time = MLtime;
				if (value >= MOD_MIN)
				{
					ch->flags |= CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 1);
				} else {
					ch->flags &= ~CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 0);
				}
			}
		}
		break;

	case ctrlVolume:		/* change volume */
		driverdata.channelVolume[channel] = value;
		/* fall-through */
	case ctrlExpression:	/* change expression */
		if (controller == ctrlExpression)
		{
			driverdata.channelExpression[channel] = value;
		}
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				ch->realvolume = calcVolume(driverdata.channelVolume[channel],
					driverdata.channelExpression[channel], ch->volume);
				io->OPLwriteVolume(i, ch->instr, ch->realvolume);
			}
		}
		break;

	case ctrlPan:			/* change pan (balance) */
		driverdata.channelPan[channel] = value -= 64;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				io->OPLwritePan(i, ch->instr, value);
			}
		}
		break;

	case ctrlSustainPedal:		/* change sustain pedal (hold) */
		driverdata.channelSustain[channel] = value;
		if (value < 0x40)
			releaseSustain(channel);
		break;

	case ctrlNotesOff:			/* turn off all notes that are not sustained */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				if (driverdata.channelSustain[id] < 0x40)
					releaseChannel(i, 0);
				else
					channels[i].flags |= CH_SUSTAIN;
			}
		}
		break;

	case ctrlSoundsOff:			/* release all notes for this channel */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				releaseChannel(i, 0);
			}
		}
		break;

	case ctrlRPNHi:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x007F) | (value << 7);
		break;

	case ctrlRPNLo:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x3F80) | value;
		break;

	case ctrlNRPNLo:
	case ctrlNRPNHi:
		driverdata.channelRPN[id] = 0x3FFF;
		break;

	case ctrlDataEntryHi:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value * 100 + (driverdata.channelPitchSens[id] % 100);
		}
		break;

	case ctrlDataEntryLo:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value + (driverdata.channelPitchSens[id] / 100) * 100;
		}
		break;
	}
}